

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadSettingsFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,char *filename)

{
  Verbosity VVar1;
  SPxOut *pSVar2;
  long *plVar3;
  size_t sVar4;
  SPxOut *pSVar5;
  bool bVar6;
  Verbosity old_verbosity;
  Verbosity old_verbosity_2;
  int t;
  string sStack_568;
  spxifstream file;
  char line [500];
  
  (*this->_statistics->readingTime->_vptr_Timer[3])();
  pSVar5 = &this->spxout;
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    pSVar2 = soplex::operator<<(pSVar5,"Loading settings file <");
    pSVar2 = soplex::operator<<(pSVar2,filename);
    soplex::operator<<(pSVar2,"> . . .\n");
    (this->spxout).m_verbosity = VVar1;
  }
  std::__cxx11::string::string((string *)&sStack_568,filename,(allocator *)line);
  zstr::ifstream::ifstream(&file,&sStack_568,_S_in,0x100000);
  std::__cxx11::string::~string((string *)&sStack_568);
  if (((&file.super_istream.field_0x20)[(long)file.super_istream._vptr_basic_istream[-3]] & 5) != 0)
  {
    VVar1 = (this->spxout).m_verbosity;
    if (2 < (int)VVar1) {
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(pSVar5,"Error opening settings file.\n");
      (this->spxout).m_verbosity = VVar1;
    }
    bVar6 = false;
    goto LAB_002c214a;
  }
  t = 1;
  while( true ) {
    plVar3 = (long *)std::istream::getline((char *)&file,(long)line);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
    _parseSettingsLine(this,line,t);
    t = t + 1;
  }
  bVar6 = (bool)(((&file.super_istream.field_0x20)[(long)file.super_istream._vptr_basic_istream[-3]]
                 & 2) >> 1);
  if (bVar6 == false) {
    sVar4 = strlen(line);
    VVar1 = (this->spxout).m_verbosity;
    if (sVar4 == 499) {
      if (2 < (int)VVar1) {
        (this->spxout).m_verbosity = INFO1;
        pSVar5 = soplex::operator<<(pSVar5,"Error reading settings file: line ");
        pSVar5 = soplex::operator<<(pSVar5,t);
        pSVar5 = soplex::operator<<(pSVar5," in settings file exceeds ");
        pSVar5 = soplex::operator<<(pSVar5,0x1f2);
        soplex::operator<<(pSVar5," characters.\n");
LAB_002c2139:
        (this->spxout).m_verbosity = VVar1;
      }
    }
    else if (2 < (int)VVar1) {
      (this->spxout).m_verbosity = INFO1;
      pSVar5 = soplex::operator<<(pSVar5,"Error reading settings file: line ");
      pSVar5 = soplex::operator<<(pSVar5,t);
      soplex::operator<<(pSVar5,".\n");
      goto LAB_002c2139;
    }
  }
  (*this->_statistics->readingTime->_vptr_Timer[4])();
LAB_002c214a:
  zstr::ifstream::~ifstream(&file);
  return bVar6;
}

Assistant:

bool SoPlexBase<R>::loadSettingsFile(const char* filename)
{
   assert(filename != nullptr);

   // start timing
   _statistics->readingTime->start();

   SPX_MSG_INFO1(spxout, spxout << "Loading settings file <" << filename << "> . . .\n");

   // open file
   spxifstream file(filename);

   if(!file)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error opening settings file.\n");
      return false;
   }

   // read file
   char line[SPX_SET_MAX_LINE_LEN];
   int lineNumber = 0;
   bool readError = false;

   while(true)
   {
      lineNumber++;
      readError = !file.getline(line, sizeof(line));

      if(readError)
         break;

      (void)_parseSettingsLine(line, lineNumber);
   }

   readError = readError && !file.eof();

   if(readError && strlen(line) == SPX_SET_MAX_LINE_LEN - 1)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error reading settings file: line " << lineNumber <<
                    " in settings file exceeds " << SPX_SET_MAX_LINE_LEN - 2 << " characters.\n");
   }
   else if(readError)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error reading settings file: line " << lineNumber << ".\n");
   }

   // stop timing
   _statistics->readingTime->stop();

   return !readError;
}